

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O1

void yprp_augment(lys_ypr_ctx_conflict *pctx,lysp_node_augment *aug)

{
  uint16_t *puVar1;
  lysp_ext_instance *plVar2;
  char *pcVar3;
  uint uVar4;
  lysp_ext_instance *plVar5;
  uint64_t u;
  lysp_ext_instance *plVar6;
  lysp_node_notif *notif;
  lysp_ext_instance *ext;
  lysp_node *node;
  lysp_node_action *action;
  
  ypr_open(pctx,"augment","target-node",(aug->field_0).node.name,'\x01');
  puVar1 = &(pctx->field_0).field_0.level;
  *puVar1 = *puVar1 + 1;
  plVar2 = (aug->field_0).node.exts;
  plVar6 = (lysp_ext_instance *)0x0;
  ext = plVar2;
  while( true ) {
    if (plVar2 == (lysp_ext_instance *)0x0) {
      plVar5 = (lysp_ext_instance *)0x0;
    }
    else {
      plVar5 = plVar2[-1].exts;
    }
    if (plVar5 <= plVar6) break;
    yprp_extension_instance(pctx,LY_STMT_AUGMENT,'\0',ext,(int8_t *)0x0);
    plVar6 = (lysp_ext_instance *)((long)&plVar6->name + 1);
    ext = ext + 1;
  }
  yprp_when(pctx,aug->when,(int8_t *)0x0);
  yprp_iffeatures(pctx,(aug->field_0).node.iffeatures,(aug->field_0).node.exts,(int8_t *)0x0);
  ypr_status(pctx,(aug->field_0).node.flags,(aug->field_0).node.exts,(int8_t *)0x0);
  pcVar3 = (aug->field_0).node.dsc;
  if (pcVar3 != (char *)0x0) {
    ypr_substmt(pctx,LY_STMT_DESCRIPTION,'\0',pcVar3,(aug->field_0).node.exts);
  }
  pcVar3 = (aug->field_0).node.ref;
  if (pcVar3 != (char *)0x0) {
    ypr_substmt(pctx,LY_STMT_REFERENCE,'\0',pcVar3,(aug->field_0).node.exts);
  }
  for (node = aug->child; node != (lysp_node *)0x0; node = node->next) {
    yprp_node(pctx,node);
  }
  for (action = aug->actions; action != (lysp_node_action *)0x0;
      action = (action->field_0).field_1.next) {
    yprp_action(pctx,action);
  }
  for (notif = aug->notifs; notif != (lysp_node_notif *)0x0; notif = (notif->field_0).field_1.next)
  {
    yprp_notification(pctx,notif);
  }
  uVar4 = *(int *)((long)&pctx->field_0 + 8) - 1;
  (pctx->field_0).field_0.level = (uint16_t)uVar4;
  uVar4 = (uVar4 & 0xffff) * 2;
  if ((undefined1  [24])((undefined1  [24])pctx->field_0 & (undefined1  [24])0x200000000) !=
      (undefined1  [24])0x0) {
    uVar4 = 0;
  }
  ly_print_((pctx->field_0).field_0.out,"%*s</%s>\n",(ulong)uVar4,"","augment");
  return;
}

Assistant:

static void
yprp_augment(struct lys_ypr_ctx *pctx, const struct lysp_node_augment *aug)
{
    struct lysp_node *child;
    struct lysp_node_action *action;
    struct lysp_node_notif *notif;

    ypr_open(pctx, "augment", "target-node", aug->nodeid, 1);
    LEVEL++;

    yprp_extension_instances(pctx, LY_STMT_AUGMENT, 0, aug->exts, NULL);
    yprp_when(pctx, aug->when, NULL);
    yprp_iffeatures(pctx, aug->iffeatures, aug->exts, NULL);
    ypr_status(pctx, aug->flags, aug->exts, NULL);
    ypr_description(pctx, aug->dsc, aug->exts, NULL);
    ypr_reference(pctx, aug->ref, aug->exts, NULL);

    LY_LIST_FOR(aug->child, child) {
        yprp_node(pctx, child);
    }

    LY_LIST_FOR(aug->actions, action) {
        yprp_action(pctx, action);
    }

    LY_LIST_FOR(aug->notifs, notif) {
        yprp_notification(pctx, notif);
    }

    LEVEL--;
    ypr_close(pctx, "augment", 1);
}